

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.h
# Opt level: O0

void adapt::cuf::Print<char_const(&)[5]>(FILE *fp,char (*args) [5])

{
  char (*args_00) [5];
  tuple<const_char_(&)[5]> local_70;
  const_pointer local_68;
  tuple<const_char_*> local_60;
  tuple<_IO_FILE_*> local_58;
  __type local_50;
  _func_int__IO_FILE_ptr_char_ptr_varargs *local_38;
  array<char,_4UL> local_2c;
  undefined8 uStack_28;
  array<char,_4UL> fmt;
  size_t n;
  __tuple_element_t<2UL,_tuple<Delimiter<32>,_End<10>,_IntegralConstant<bool,_false>,_IntegralConstant<unsigned_long,_1UL>_>_>
  f;
  __tuple_element_t<1UL,_tuple<Delimiter<32>,_End<10>,_IntegralConstant<bool,_false>,_IntegralConstant<unsigned_long,_1UL>_>_>
  e;
  __tuple_element_t<0UL,_tuple<Delimiter<32>,_End<10>,_IntegralConstant<bool,_false>,_IntegralConstant<unsigned_long,_1UL>_>_>
  d;
  tuple<adapt::cuf::detail::print::Delimiter<32>,_adapt::cuf::detail::print::End<10>,_adapt::cuf::IntegralConstant<bool,_false>,_adapt::cuf::IntegralConstant<unsigned_long,_1UL>_>
  t;
  char (*args_local) [5];
  FILE *fp_local;
  
  uStack_28 = 1;
  builtin_strncpy(local_2c._M_elems,"%s\n",4);
  local_38 = fprintf;
  std::make_tuple<_IO_FILE*&>((_IO_FILE **)&local_58);
  local_68 = std::array<char,_4UL>::data(&local_2c);
  std::make_tuple<char_const*>((char **)&local_60);
  args_00 = detail::ConvStringToCharPtr<const_char_(&)[5],_nullptr>(args);
  GetFrontArgs<1ul,char_const(&)[5]>((cuf *)&local_70,args_00);
  std::tuple_cat<std::tuple<_IO_FILE*>,std::tuple<char_const*>,std::tuple<char_const(&)[5]>,void>
            (&local_50,&local_58,&local_60,&local_70);
  Apply<int(*)(_IO_FILE*,char_const*,___),std::tuple<_IO_FILE*,char_const*,char_const(&)[5]>>
            (&local_38,&local_50);
  detail::Flush<adapt::cuf::IntegralConstant<bool,false>const>(fp);
  return;
}

Assistant:

void Print(FILE* fp, Args&& ...args)
{
	constexpr auto t = detail::GetOptions<std::decay_t<Args>...>();
	constexpr auto d = std::get<0>(t);
	constexpr auto e = std::get<1>(t);
	constexpr auto f = std::get<2>(t);
	constexpr size_t n = std::get<3>(t).value;
	constexpr auto fmt = detail::MakeFormatStr<decltype(d), decltype(e), GetFrontTypesT<n, std::decay_t<Args>...>>::apply();
	Apply(&fprintf, std::tuple_cat(std::make_tuple(fp), std::make_tuple(fmt.data()), GetFrontArgs<n>(detail::ConvStringToCharPtr(std::forward<Args>(args))...)));
	detail::Flush<decltype(f)>(fp);
}